

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

Vec_Int_t * Cba_NtkCollectInFons(Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  int iVar4;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_BitStart((p->vFonObj).nSize);
  for (iVar4 = 0; iVar1 = vObjs->nSize, iVar4 < iVar1; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar4);
    iVar2 = Cba_ObjFin0(p,iVar1);
    for (; iVar3 = Cba_ObjFin0(p,iVar1 + 1), iVar2 < iVar3; iVar2 = iVar2 + 1) {
      iVar3 = Cba_FinFon(p,iVar2);
      if (0 < iVar3) {
        Vec_BitWriteEntry(p_01,iVar3,1);
      }
    }
  }
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar4);
    iVar2 = Cba_ObjFon0(p,iVar1);
    for (; iVar3 = Cba_ObjFon0(p,iVar1 + 1), iVar2 < iVar3; iVar2 = iVar2 + 1) {
      Vec_BitWriteEntry(p_01,iVar2,0);
    }
    iVar1 = vObjs->nSize;
  }
  iVar4 = p_01->nSize;
  iVar1 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = Vec_BitEntry(p_01,iVar1);
    if (iVar2 != 0) {
      Vec_IntPush(p_00,iVar1);
    }
  }
  Vec_BitFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectInFons( Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Vec_Int_t * vFons = Vec_IntAlloc( 100 );
    Vec_Bit_t * vVisFons = Vec_BitStart( Cba_NtkFonNum(p) + 1 );
    int i, k, iObj, iFin, iFon, Entry;
    // mark fanin fons
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            if ( iFon > 0 )
                Vec_BitWriteEntry( vVisFons, iFon, 1 );
    // unmark internal fons
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFon( p, iObj, iFon, k )
            Vec_BitWriteEntry( vVisFons, iFon, 0 );
    // collect fons
    Vec_BitForEachEntry( vVisFons, Entry, iFon )
        if ( Entry )
            Vec_IntPush( vFons, iFon );
    Vec_BitFree( vVisFons );
    return vFons;
}